

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WrapTCPService.cpp
# Opt level: O2

AddSessionOptionFunc *
brynet::net::AddSessionOption::WithEnterCallback
          (AddSessionOptionFunc *__return_storage_ptr__,SESSION_ENTER_CALLBACK *callback)

{
  undefined8 *puVar1;
  _Any_data local_30;
  long local_20;
  undefined8 uStack_18;
  
  std::function<void_(const_std::shared_ptr<brynet::net::TCPSession>_&)>::function
            ((function<void_(const_std::shared_ptr<brynet::net::TCPSession>_&)> *)&local_30,callback
            );
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  puVar1 = (undefined8 *)operator_new(0x20);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = uStack_18;
  if (local_20 != 0) {
    *puVar1 = local_30._M_unused._M_object;
    puVar1[1] = local_30._8_8_;
    puVar1[2] = local_20;
    local_20 = 0;
    uStack_18 = 0;
  }
  *(undefined8 **)&(__return_storage_ptr__->super__Function_base)._M_functor = puVar1;
  __return_storage_ptr__->_M_invoker =
       std::
       _Function_handler<void_(brynet::net::AddSessionOption::Options_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/WrapTCPService.cpp:160:12)>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       std::
       _Function_handler<void_(brynet::net::AddSessionOption::Options_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/WrapTCPService.cpp:160:12)>
       ::_M_manager;
  std::_Function_base::~_Function_base((_Function_base *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

AddSessionOption::AddSessionOptionFunc AddSessionOption::WithEnterCallback(TCPSession::SESSION_ENTER_CALLBACK callback)
{
    return [=](AddSessionOption::Options& option) {
        option.enterCallback = callback;
    };
}